

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

OffsetData * __thiscall QTimeZone::nextTransition(QTimeZone *this,QDateTime *afterDateTime)

{
  bool bVar1;
  TimeSpec TVar2;
  QTimeZonePrivate *pQVar3;
  qint64 qVar4;
  Data *in_RDX;
  ShortData *in_RSI;
  OffsetData *in_RDI;
  long in_FS_OFFSET;
  QDateTime *in_stack_ffffffffffffffa0;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = Data::isShort((Data *)in_RSI);
  if (bVar1) {
    TVar2 = ShortData::spec(in_RSI);
    if (TVar2 == LocalTime) {
      systemTimeZone();
      nextTransition((QTimeZone *)in_RDX,in_stack_ffffffffffffffa0);
      ~QTimeZone((QTimeZone *)0x58143d);
      goto LAB_005814fa;
    }
  }
  else {
    bVar1 = hasTransitions((QTimeZone *)in_RDI);
    if (bVar1) {
      pQVar3 = Data::operator->((Data *)in_RSI);
      qVar4 = QDateTime::toMSecsSinceEpoch((QDateTime *)in_RDI);
      (*pQVar3->_vptr_QTimeZonePrivate[0x11])(local_38,pQVar3,qVar4);
      QTimeZonePrivate::toOffsetData(in_RDX);
      QTimeZonePrivate::Data::~Data((Data *)0x5814ce);
      goto LAB_005814fa;
    }
  }
  QTimeZonePrivate::invalidOffsetData();
LAB_005814fa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTimeZone::OffsetData QTimeZone::nextTransition(const QDateTime &afterDateTime) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().nextTransition(afterDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            break;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (hasTransitions()) {
        return QTimeZonePrivate::toOffsetData(d->nextTransition(afterDateTime.toMSecsSinceEpoch()));
    }

    return QTimeZonePrivate::invalidOffsetData();
}